

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result wabt::interp::Memory::Copy(Memory *dst,u64 dst_offset,Memory *src,u64 src_offset,u64 size)

{
  bool bVar1;
  Enum EVar2;
  
  bVar1 = IsValidAccess(dst,dst_offset,0,size);
  EVar2 = Error;
  if (bVar1) {
    bVar1 = IsValidAccess(src,src_offset,0,size);
    if (bVar1) {
      EVar2 = Ok;
      if (size != 0) {
        memmove((dst->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start + dst_offset,
                (src->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start + src_offset,size);
      }
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Memory::Copy(Memory& dst,
                    u64 dst_offset,
                    const Memory& src,
                    u64 src_offset,
                    u64 size) {
  if (dst.IsValidAccess(dst_offset, 0, size) &&
      src.IsValidAccess(src_offset, 0, size)) {
#if WABT_BIG_ENDIAN
    auto src_begin = src.data_.end() - src_offset - size;
    auto dst_begin = dst.data_.end() - dst_offset - size;
#else
    auto src_begin = src.data_.begin() + src_offset;
    auto dst_begin = dst.data_.begin() + dst_offset;
#endif
    auto src_end = src_begin + size;
    auto dst_end = dst_begin + size;
    if (src.self() == dst.self() && src_begin < dst_begin) {
      std::move_backward(src_begin, src_end, dst_end);
    } else {
      std::move(src_begin, src_end, dst_begin);
    }
    return Result::Ok;
  }
  return Result::Error;
}